

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

void __thiscall
QKeyEvent::QKeyEvent
          (QKeyEvent *this,Type type,int key,KeyboardModifiers modifiers,QString *text,bool autorep,
          quint16 count)

{
  long lVar1;
  byte bVar2;
  undefined4 in_EDX;
  int in_ESI;
  QEvent *in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  ushort in_stack_00000008;
  QString *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  undefined7 in_stack_ffffffffffffffb0;
  QFlagsStorage<Qt::KeyboardModifier> modifiers_00;
  QString *in_stack_ffffffffffffffe0;
  
  modifiers_00.i = (Int)((ulong)in_R8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_R9B & 1;
  iVar3 = in_ESI;
  QString::QString((QString *)0x34c247);
  QInputDevice::primaryKeyboard(in_stack_ffffffffffffffe0);
  QInputEvent::QInputEvent
            ((QInputEvent *)CONCAT17(bVar2,in_stack_ffffffffffffffb0),(Type)((ulong)in_RDI >> 0x20),
             (QInputDevice *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),
             (KeyboardModifiers)modifiers_00.i);
  QString::~QString((QString *)0x34c278);
  *(undefined ***)in_RDI = &PTR__QKeyEvent_00e15898;
  QString::QString((QString *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  *(undefined4 *)(in_RDI + 0x40) = in_EDX;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  *(ushort *)(in_RDI + 0x50) = *(ushort *)(in_RDI + 0x50) & 0x8000 | in_stack_00000008 & 0x7fff;
  *(ushort *)(in_RDI + 0x50) = *(ushort *)(in_RDI + 0x50) & 0x7fff | (ushort)(bVar2 & 1) << 0xf;
  if (in_ESI == 0x33) {
    QEvent::ignore(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QKeyEvent::QKeyEvent(Type type, int key, Qt::KeyboardModifiers modifiers, const QString& text,
                     bool autorep, quint16 count)
    : QInputEvent(type, QInputDevice::primaryKeyboard(), modifiers), m_text(text), m_key(key),
      m_scanCode(0), m_virtualKey(0), m_nativeModifiers(0),
      m_count(count), m_autoRepeat(autorep)
{
     if (type == QEvent::ShortcutOverride)
        ignore();
}